

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O1

PyObject * libxml_xmlCanonicPath(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *str;
  PyObject *pPVar2;
  xmlChar *path;
  undefined8 local_10;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"z:xmlCanonicPath",&local_10);
  if (iVar1 != 0) {
    str = (xmlChar *)xmlCanonicPath(local_10);
    pPVar2 = libxml_xmlCharPtrWrap(str);
  }
  return pPVar2;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlCanonicPath(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    xmlChar * c_retval;
    xmlChar * path;

    if (!PyArg_ParseTuple(args, (char *)"z:xmlCanonicPath", &path))
        return(NULL);

    c_retval = xmlCanonicPath(path);
    py_retval = libxml_xmlCharPtrWrap((xmlChar *) c_retval);
    return(py_retval);
}